

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spawn_location.hpp
# Opt level: O2

void __thiscall SpawnLocation::apply_json(SpawnLocation *this,Json *json)

{
  bool bVar1;
  uchar uVar2;
  unsigned_short uVar3;
  const_reference pvVar4;
  allocator<char> local_59;
  key_type local_58;
  key_type local_38;
  
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[6],_0>(json,(char (*) [6])"mapId");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"mapId",(allocator<char> *)&local_38);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_58);
    uVar3 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<unsigned_short,_0>(pvVar4);
    this->_map_id = uVar3;
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[5],_0>(json,(char (*) [5])"posX");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"posX",(allocator<char> *)&local_38);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_58);
    uVar2 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<unsigned_char,_0>(pvVar4);
    this->_pos_x = uVar2;
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[5],_0>(json,(char (*) [5])"posY");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"posY",(allocator<char> *)&local_38);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_58);
    uVar2 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<unsigned_char,_0>(pvVar4);
    this->_pos_y = uVar2;
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[12],_0>(json,(char (*) [12])"orientation");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"orientation",(allocator<char> *)&local_38);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_58);
    uVar2 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<unsigned_char,_0>(pvVar4);
    this->_orientation = uVar2;
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[7],_0>(json,(char (*) [7])"nodeId");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"nodeId",&local_59);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_38);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_58,pvVar4);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->_node_id,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[13],_0>(json,(char (*) [13])"startingLife");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"startingLife",(allocator<char> *)&local_38);
    pvVar4 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_58);
    uVar2 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<unsigned_char,_0>(pvVar4);
    this->_starting_life = uVar2;
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void apply_json(const Json& json)
    {
        if(json.contains("mapId"))
            _map_id = json.at("mapId");
        if(json.contains("posX"))
            _pos_x = json.at("posX");
        if(json.contains("posY"))
            _pos_y = json.at("posY");
        if(json.contains("orientation"))
            _orientation = json.at("orientation");
        if(json.contains("nodeId"))
            _node_id = json.at("nodeId");
        if(json.contains("startingLife"))
            _starting_life = json.at("startingLife");        
    }